

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode parse_authority(Curl_URL *u,char *auth,size_t authlen,uint flags,dynbuf *host,
                         _Bool has_scheme)

{
  Curl_URL *pCVar1;
  dynbuf *s;
  bool bVar2;
  CURLcode CVar3;
  CURLUcode CVar4;
  void *pvVar5;
  Curl_handler *pCVar6;
  char *pcVar7;
  char *pcVar8;
  int *piVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char **optionsp_00;
  ulong uVar15;
  undefined7 in_register_00000089;
  ulong uVar16;
  int iVar17;
  long lVar18;
  char *passwdp;
  Curl_URL *local_70;
  char *userp;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  char *optionsp;
  undefined4 local_3c;
  dynbuf *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000089,has_scheme);
  userp = (char *)0x0;
  passwdp = (char *)0x0;
  optionsp = (char *)0x0;
  pvVar5 = memchr(auth,0x40,authlen);
  local_70 = u;
  local_38 = host;
  if (pvVar5 == (void *)0x0) {
    pcVar7 = (char *)0x0;
    CVar4 = CURLUE_OK;
LAB_0015d428:
    pCVar1 = local_70;
    (*Curl_cfree)(pcVar7);
    (*Curl_cfree)(passwdp);
    (*Curl_cfree)(optionsp);
    pCVar1->options = (char *)0x0;
    pCVar1->user = (char *)0x0;
    pCVar1->password = (char *)0x0;
    if (pvVar5 != (void *)0x0) {
      return CVar4;
    }
    lVar18 = 0;
  }
  else {
    if (u->scheme == (char *)0x0) {
      lVar18 = (long)pvVar5 + (1 - (long)auth);
LAB_0015d3fd:
      optionsp_00 = (char **)0x0;
    }
    else {
      pCVar6 = Curl_get_scheme_handler(u->scheme);
      lVar18 = (long)pvVar5 + (1 - (long)auth);
      if (pCVar6 == (Curl_handler *)0x0) goto LAB_0015d3fd;
      optionsp_00 = &optionsp;
      if ((pCVar6->flags & 0x400) == 0) {
        optionsp_00 = (char **)0x0;
      }
    }
    CVar3 = Curl_parse_login_details(auth,lVar18 - 1,&userp,&passwdp,optionsp_00);
    pCVar1 = local_70;
    pcVar7 = userp;
    if (CVar3 != CURLE_OK) {
      CVar4 = CURLUE_BAD_LOGIN;
      goto LAB_0015d428;
    }
    if (userp != (char *)0x0) {
      if ((flags & 0x20) != 0) {
        CVar4 = CURLUE_USER_NOT_ALLOWED;
        goto LAB_0015d428;
      }
      (*Curl_cfree)(local_70->user);
      pCVar1->user = userp;
    }
    if (passwdp != (char *)0x0) {
      (*Curl_cfree)(pCVar1->password);
      pCVar1->password = passwdp;
    }
    if (optionsp != (char *)0x0) {
      (*Curl_cfree)(pCVar1->options);
      pCVar1->options = optionsp;
    }
  }
  s = local_38;
  CVar3 = Curl_dyn_addn(local_38,auth + lVar18,authlen - lVar18);
  CVar4 = CURLUE_OUT_OF_MEMORY;
  if (CVar3 != CURLE_OK) {
    if (CVar3 != CURLE_TOO_LARGE) {
      return CURLUE_OUT_OF_MEMORY;
    }
    return CURLUE_TOO_LARGE;
  }
  pcVar7 = Curl_dyn_ptr(s);
  if (*pcVar7 == '[') {
    pcVar8 = strchr(pcVar7,0x5d);
    if (pcVar8 == (char *)0x0) {
      return CURLUE_BAD_IPV6;
    }
    if (pcVar8[1] != '\0') {
      if (pcVar8[1] != ':') {
        return CURLUE_BAD_PORT_NUMBER;
      }
      pcVar8 = pcVar8 + 1;
LAB_0015d555:
      userp = (char *)0x0;
      Curl_dyn_setlen(s,(long)pcVar8 - (long)pcVar7);
      if (pcVar8[1] == '\0') {
        if ((char)local_3c == '\0') {
          return CURLUE_BAD_PORT_NUMBER;
        }
      }
      else {
        if (9 < (byte)(pcVar8[1] - 0x30U)) {
          return CURLUE_BAD_PORT_NUMBER;
        }
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = strtoul(pcVar8 + 1,&userp,10);
        pCVar1 = local_70;
        if (*piVar9 != 0) {
          return CURLUE_BAD_PORT_NUMBER;
        }
        if (0xffff < uVar10) {
          return CURLUE_BAD_PORT_NUMBER;
        }
        if (*userp != '\0') {
          return CURLUE_BAD_PORT_NUMBER;
        }
        local_70->portnum = (unsigned_short)uVar10;
        (*Curl_cfree)(local_70->port);
        pcVar7 = curl_maprintf("%ld",uVar10);
        pCVar1->port = pcVar7;
        if (pcVar7 == (char *)0x0) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
    }
  }
  else {
    pcVar8 = strchr(pcVar7,0x3a);
    if (pcVar8 != (char *)0x0) goto LAB_0015d555;
  }
  sVar11 = Curl_dyn_len(s);
  if (sVar11 == 0) {
    return CURLUE_NO_HOST;
  }
  pcVar7 = Curl_dyn_ptr(s);
  local_58 = 0;
  uStack_50 = 0;
  userp = (char *)0x0;
  uStack_60 = 0;
  if (*pcVar7 == '[') {
    pcVar7 = Curl_dyn_ptr(s);
    sVar11 = Curl_dyn_len(s);
    CVar4 = ipv6_parse(local_70,pcVar7,sVar11);
    return CVar4;
  }
  piVar9 = __errno_location();
  *piVar9 = 0;
  bVar2 = false;
  iVar17 = 0;
  while (uVar14 = uStack_50, uVar16 = local_58, uVar10 = uStack_60, pcVar8 = userp, !bVar2) {
    passwdp = (char *)0x0;
    if (((9 < (byte)(*pcVar7 - 0x30U)) ||
        (pcVar7 = (char *)strtoul(pcVar7,&passwdp,0), *piVar9 != 0)) || ((ulong)pcVar7 >> 0x20 != 0)
       ) goto LAB_0015d82b;
    (&userp)[iVar17] = pcVar7;
    bVar2 = true;
    pcVar7 = passwdp;
    if (*passwdp != '\0') {
      if ((*passwdp != '.') || (iVar17 == 3)) goto LAB_0015d82b;
      iVar17 = iVar17 + 1;
      pcVar7 = passwdp + 1;
      bVar2 = false;
    }
  }
  switch(iVar17) {
  case 0:
    Curl_dyn_reset(s);
    uVar13 = (ulong)userp >> 0x18;
    uVar12 = (ulong)((uint)((ulong)userp >> 0x10) & 0xff);
    uVar15 = (ulong)((uint)((ulong)userp >> 8) & 0xff);
    uVar16 = (ulong)((uint)userp & 0xff);
    break;
  case 1:
    if (0xffffff < uStack_60 || (char *)0xff < userp) {
LAB_0015d82b:
      pcVar7 = Curl_dyn_ptr(s);
      pcVar8 = strchr(pcVar7,0x25);
      pCVar1 = local_70;
      if (pcVar8 != (char *)0x0) {
        CVar3 = Curl_urldecode(pcVar7,0,&passwdp,(size_t *)&userp,REJECT_CTRL);
        if (CVar3 != CURLE_OK) {
          return CURLUE_BAD_HOSTNAME;
        }
        Curl_dyn_reset(s);
        CVar3 = Curl_dyn_addn(s,passwdp,(size_t)userp);
        (*Curl_cfree)(passwdp);
        if (CVar3 != CURLE_OK) {
          if (CVar3 != CURLE_TOO_LARGE) {
            return CURLUE_OUT_OF_MEMORY;
          }
          return CURLUE_TOO_LARGE;
        }
      }
      pcVar7 = Curl_dyn_ptr(s);
      sVar11 = Curl_dyn_len(s);
      CVar4 = hostname_check(pCVar1,pcVar7,sVar11);
      return CVar4;
    }
    Curl_dyn_reset(s);
    uVar12 = uVar10 >> 0x10 & 0xffff;
    uVar15 = (ulong)((uint)(uVar10 >> 8) & 0xff);
    uVar14 = (ulong)((uint)uVar10 & 0xff);
    goto LAB_0015d901;
  case 2:
    if (0xffff < local_58 || (0xff < uStack_60 || (char *)0xff < userp)) goto LAB_0015d82b;
    Curl_dyn_reset(s);
    uVar15 = uVar16 >> 8 & 0xffffff;
    uVar16 = uVar16 & 0xff;
    uVar13 = (ulong)pcVar8 & 0xffffffff;
    uVar12 = uVar10 & 0xffffffff;
    break;
  case 3:
    if ((0xff < uStack_50 || 0xff < local_58) || (0xff < uStack_60 || (char *)0xff < userp))
    goto LAB_0015d82b;
    Curl_dyn_reset(s);
    uVar12 = uVar10 & 0xffffffff;
    uVar15 = uVar16 & 0xffffffff;
LAB_0015d901:
    uVar13 = (ulong)pcVar8 & 0xffffffff;
    uVar16 = uVar14 & 0xffffffff;
    break;
  default:
    goto switchD_0015d70c_default;
  }
  CVar3 = Curl_dyn_addf(s,"%u.%u.%u.%u",uVar13,uVar12,uVar15,uVar16);
  if (CVar3 == CURLE_OK) {
switchD_0015d70c_default:
    CVar4 = CURLUE_OK;
  }
  return CVar4;
}

Assistant:

static CURLUcode parse_authority(struct Curl_URL *u,
                                 const char *auth, size_t authlen,
                                 unsigned int flags,
                                 struct dynbuf *host,
                                 bool has_scheme)
{
  size_t offset;
  CURLUcode uc;
  CURLcode result;

  /*
   * Parse the login details and strip them out of the hostname.
   */
  uc = parse_hostname_login(u, auth, authlen, flags, &offset);
  if(uc)
    goto out;

  result = Curl_dyn_addn(host, auth + offset, authlen - offset);
  if(result) {
    uc = cc2cu(result);
    goto out;
  }

  uc = Curl_parse_port(u, host, has_scheme);
  if(uc)
    goto out;

  if(!Curl_dyn_len(host))
    return CURLUE_NO_HOST;

  switch(ipv4_normalize(host)) {
  case HOST_IPV4:
    break;
  case HOST_IPV6:
    uc = ipv6_parse(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_NAME:
    uc = urldecode_host(host);
    if(!uc)
      uc = hostname_check(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_ERROR:
    uc = CURLUE_OUT_OF_MEMORY;
    break;
  default:
    uc = CURLUE_BAD_HOSTNAME; /* Bad IPv4 address even */
    break;
  }

out:
  return uc;
}